

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O0

void Gli_ManSetDataSaved(Gli_Man_t *p,int iBit)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  int local_24;
  Gli_Obj_t *pGStack_20;
  int i;
  Gli_Obj_t *pObj;
  int iBit_local;
  Gli_Man_t *p_local;
  
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar3 = false;
    if (local_24 < iVar1) {
      iVar1 = Vec_IntEntry(p->vCis,local_24);
      pGStack_20 = Gli_ManObj(p,iVar1);
      bVar3 = pGStack_20 != (Gli_Obj_t *)0x0;
    }
    if (!bVar3) break;
    uVar2 = p->pSimInfoPrev[local_24] >> ((byte)iBit & 0x1f) & 1;
    *(uint *)pGStack_20 = *(uint *)pGStack_20 & 0xfffffffb | uVar2 << 2;
    *(uint *)pGStack_20 = *(uint *)pGStack_20 & 0xfffffffd | uVar2 << 1;
    local_24 = local_24 + 1;
  }
  local_24 = 0;
  while( true ) {
    bVar3 = false;
    if (local_24 < p->nObjData) {
      pGStack_20 = Gli_ManObj(p,local_24);
      bVar3 = pGStack_20 != (Gli_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gli_ObjIsTerm(pGStack_20);
    if (iVar1 == 0) {
      uVar2 = Gli_NodeComputeValue(pGStack_20);
      *(uint *)pGStack_20 = *(uint *)pGStack_20 & 0xfffffffb | (uVar2 & 1) << 2;
      *(uint *)pGStack_20 = *(uint *)pGStack_20 & 0xfffffffd | (uVar2 & 1) << 1;
    }
    iVar1 = Gli_ObjSize(pGStack_20);
    local_24 = iVar1 + local_24;
  }
  return;
}

Assistant:

void Gli_ManSetDataSaved( Gli_Man_t * p, int iBit )
{
    Gli_Obj_t * pObj;
    int i;
    Gli_ManForEachCi( p, pObj, i )
        pObj->fPhase = pObj->fPhase2 = ((p->pSimInfoPrev[i] >> iBit) & 1);
    Gli_ManForEachNode( p, pObj, i )
        pObj->fPhase = pObj->fPhase2 = Gli_NodeComputeValue( pObj );
}